

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaPtr xmlSchemaParse(xmlSchemaParserCtxtPtr ctxt)

{
  int iVar1;
  xmlSchemaPtr schema;
  xmlSchemaConstructionCtxtPtr pxVar2;
  xmlChar *in_R8;
  char *message;
  xmlChar *str1;
  xmlSchemaBucketPtr_conflict bucket;
  xmlSchemaBucketPtr_conflict local_18;
  
  local_18 = (xmlSchemaBucketPtr_conflict)0x0;
  xmlSchemaInitTypes();
  if (ctxt == (xmlSchemaParserCtxtPtr)0x0) {
    return (xmlSchemaPtr)0x0;
  }
  ctxt->err = 0;
  ctxt->nberrors = 0;
  ctxt->counter = 0;
  schema = xmlSchemaNewSchema(ctxt);
  if (schema == (xmlSchemaPtr)0x0) {
LAB_001b1b82:
    if (ctxt->constructor != (xmlSchemaConstructionCtxtPtr)0x0) {
      xmlSchemaConstructionCtxtFree(ctxt->constructor);
      ctxt->constructor = (xmlSchemaConstructionCtxtPtr)0x0;
      ctxt->ownsConstructor = 0;
    }
    schema = (xmlSchemaPtr)0x0;
    xmlSchemaInternalErr2
              ((xmlSchemaAbstractCtxtPtr)ctxt,"xmlSchemaParse","An internal error occurred",
               (xmlChar *)0x0,in_R8);
    goto LAB_001b1c4b;
  }
  pxVar2 = ctxt->constructor;
  if (pxVar2 == (xmlSchemaConstructionCtxtPtr)0x0) {
    pxVar2 = xmlSchemaConstructionCtxtCreate(ctxt->dict);
    ctxt->constructor = pxVar2;
    if (pxVar2 == (xmlSchemaConstructionCtxtPtr)0x0) {
      return (xmlSchemaPtr)0x0;
    }
    ctxt->ownsConstructor = 1;
  }
  pxVar2->mainSchema = schema;
  in_R8 = (xmlChar *)ctxt->buffer;
  iVar1 = xmlSchemaAddSchemaDoc
                    (ctxt,0,ctxt->URL,ctxt->doc,(char *)in_R8,ctxt->size,(xmlNodePtr)0x0,
                     (xmlChar *)0x0,(xmlChar *)0x0,&local_18);
  if (iVar1 == -1) goto LAB_001b1b7a;
  if (iVar1 == 0) {
    if (local_18 == (xmlSchemaBucketPtr_conflict)0x0) {
      str1 = ctxt->URL;
      if (str1 == (xmlChar *)0x0) {
        message = "Failed to locate the main schema resource";
        str1 = (xmlChar *)0x0;
      }
      else {
        message = "Failed to locate the main schema resource at \'%s\'";
      }
      xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_FAILED_LOAD,(xmlNodePtr)0x0,
                          (xmlSchemaBasicItemPtr)0x0,message,str1,(xmlChar *)0x0,(xmlChar *)0x0,
                          (xmlChar *)0x0);
      goto LAB_001b1c1d;
    }
    iVar1 = xmlSchemaParseNewDocWithContext(ctxt,schema,local_18);
    if (iVar1 == -1) {
LAB_001b1b7a:
      xmlSchemaFree(schema);
      goto LAB_001b1b82;
    }
    if (ctxt->nberrors == 0) {
      schema->doc = local_18->doc;
      schema->preserve = ctxt->preserve;
      ctxt->schema = schema;
      iVar1 = xmlSchemaFixupComponents(ctxt,ctxt->constructor->mainBucket);
      if (iVar1 != -1) goto LAB_001b1c1d;
      goto LAB_001b1b7a;
    }
  }
  else {
LAB_001b1c1d:
    if (ctxt->nberrors == 0) goto LAB_001b1c4b;
  }
  xmlSchemaFree(schema);
  if (ctxt->constructor != (xmlSchemaConstructionCtxtPtr)0x0) {
    xmlSchemaConstructionCtxtFree(ctxt->constructor);
    ctxt->constructor = (xmlSchemaConstructionCtxtPtr)0x0;
    ctxt->ownsConstructor = 0;
  }
  schema = (xmlSchemaPtr)0x0;
LAB_001b1c4b:
  ctxt->schema = (xmlSchemaPtr)0x0;
  return schema;
}

Assistant:

xmlSchemaPtr
xmlSchemaParse(xmlSchemaParserCtxtPtr ctxt)
{
    xmlSchemaPtr mainSchema = NULL;
    xmlSchemaBucketPtr bucket = NULL;
    int res;

    /*
    * This one is used if the schema to be parsed was specified via
    * the API; i.e. not automatically by the validated instance document.
    */

    xmlSchemaInitTypes();

    if (ctxt == NULL)
        return (NULL);

    /* TODO: Init the context. Is this all we need?*/
    ctxt->nberrors = 0;
    ctxt->err = 0;
    ctxt->counter = 0;

    /* Create the *main* schema. */
    mainSchema = xmlSchemaNewSchema(ctxt);
    if (mainSchema == NULL)
	goto exit_failure;
    /*
    * Create the schema constructor.
    */
    if (ctxt->constructor == NULL) {
	ctxt->constructor = xmlSchemaConstructionCtxtCreate(ctxt->dict);
	if (ctxt->constructor == NULL)
	    return(NULL);
	/* Take ownership of the constructor to be able to free it. */
	ctxt->ownsConstructor = 1;
    }
    ctxt->constructor->mainSchema = mainSchema;
    /*
    * Locate and add the schema document.
    */
    res = xmlSchemaAddSchemaDoc(ctxt, XML_SCHEMA_SCHEMA_MAIN,
	ctxt->URL, ctxt->doc, ctxt->buffer, ctxt->size, NULL,
	NULL, NULL, &bucket);
    if (res == -1)
	goto exit_failure;
    if (res != 0)
	goto exit;

    if (bucket == NULL) {
	/* TODO: Error code, actually we failed to *locate* the schema. */
	if (ctxt->URL)
	    xmlSchemaCustomErr(ACTXT_CAST ctxt, XML_SCHEMAP_FAILED_LOAD,
		NULL, NULL,
		"Failed to locate the main schema resource at '%s'",
		ctxt->URL, NULL);
	else
	    xmlSchemaCustomErr(ACTXT_CAST ctxt, XML_SCHEMAP_FAILED_LOAD,
		NULL, NULL,
		"Failed to locate the main schema resource",
		    NULL, NULL);
	goto exit;
    }
    /* Then do the parsing for good. */
    if (xmlSchemaParseNewDocWithContext(ctxt, mainSchema, bucket) == -1)
	goto exit_failure;
    if (ctxt->nberrors != 0)
	goto exit;

    mainSchema->doc = bucket->doc;
    mainSchema->preserve = ctxt->preserve;

    ctxt->schema = mainSchema;

    if (xmlSchemaFixupComponents(ctxt, WXS_CONSTRUCTOR(ctxt)->mainBucket) == -1)
	goto exit_failure;

    /*
    * TODO: This is not nice, since we cannot distinguish from the
    * result if there was an internal error or not.
    */
exit:
    if (ctxt->nberrors != 0) {
	if (mainSchema) {
	    xmlSchemaFree(mainSchema);
	    mainSchema = NULL;
	}
	if (ctxt->constructor) {
	    xmlSchemaConstructionCtxtFree(ctxt->constructor);
	    ctxt->constructor = NULL;
	    ctxt->ownsConstructor = 0;
	}
    }
    ctxt->schema = NULL;
    return(mainSchema);
exit_failure:
    /*
    * Quite verbose, but should catch internal errors, which were
    * not communicated.
    */
    if (mainSchema) {
        xmlSchemaFree(mainSchema);
	mainSchema = NULL;
    }
    if (ctxt->constructor) {
	xmlSchemaConstructionCtxtFree(ctxt->constructor);
	ctxt->constructor = NULL;
	ctxt->ownsConstructor = 0;
    }
    PERROR_INT2("xmlSchemaParse",
	"An internal error occurred");
    ctxt->schema = NULL;
    return(NULL);
}